

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

tb_page_addr_t
get_page_addr_code_hostp_m68k(CPUArchState_conflict3 *env,target_ulong_conflict addr,void **hostp)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  ram_addr_t rVar4;
  ulong uVar5;
  uint uVar6;
  void *ptr;
  long lVar7;
  uint page;
  CPUM68KState_conflict *__mptr;
  bool bVar8;
  
  bVar8 = (env->sr & 0x2000) == 0;
  uVar1 = (ulong)bVar8;
  uVar6 = env->dregs[uVar1 * 4 + -0xc] >> 6 & addr >> 0xc;
  uVar5 = (ulong)(uVar6 << 6);
  lVar7 = *(long *)(env->dregs + uVar1 * 4 + -10) + uVar5;
  uVar3 = *(uint *)(*(long *)(env->dregs + uVar1 * 4 + -10) + 8 + uVar5);
  page = addr & 0xfffff000;
  rVar4 = 0xffffffffffffffff;
  if ((uVar3 & 0xfffff800) != page) {
    _Var2 = victim_tlb_hit(env,(ulong)bVar8,(ulong)uVar6,8,page);
    if (_Var2) {
      uVar3 = *(uint *)(lVar7 + 8);
    }
    else {
      tlb_fill((CPUState *)(env[-0x40].fregs + 2),addr,0,MMU_INST_FETCH,(uint)bVar8,0);
      uVar5 = (ulong)((addr >> 0xc & env->dregs[uVar1 * 4 + -0xc] >> 6) << 6);
      uVar3 = *(uint *)(*(long *)(env->dregs + uVar1 * 4 + -10) + 8 + uVar5);
      if ((uVar3 >> 0xb & 1) != 0) {
        return 0xffffffffffffffff;
      }
      lVar7 = *(long *)(env->dregs + uVar1 * 4 + -10) + uVar5;
    }
    if ((uVar3 & 0xfffff800) != page) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_m68k(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((uVar3 >> 9 & 1) == 0) {
    ptr = (void *)((ulong)addr + *(long *)(lVar7 + 0x10));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    rVar4 = qemu_ram_addr_from_host_m68k(env->uc,ptr);
    if (rVar4 == 0xffffffffffffffff) {
      abort();
    }
  }
  else if (hostp != (void **)0x0) {
    *hostp = (void *)0x0;
  }
  return rVar4;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}